

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  ssl_connect_state sVar1;
  curl_proxytype cVar2;
  Curl_easy *pCVar3;
  ASN1_TYPE *pAVar4;
  ENGINE *e;
  curl_ssl_ctx_callback p_Var5;
  byte bVar6;
  _Bool _Var7;
  int iVar8;
  uint uVar9;
  CURLcode CVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  time_t timeout_ms;
  uint *puVar15;
  ulong uVar16;
  long lVar17;
  SSL_CIPHER *c;
  char *pcVar18;
  timediff_t tVar19;
  SSL_METHOD *meth;
  SSL_CTX *pSVar20;
  BIO_METHOD *pBVar21;
  char **ppcVar22;
  BIO *pBVar23;
  X509 *pXVar24;
  X509_NAME *pXVar25;
  size_t sVar26;
  undefined8 uVar27;
  ASN1_INTEGER *pAVar28;
  ASN1_STRING *pAVar29;
  X509_EXTENSION *ex;
  BIO *out;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar30;
  EVP_PKEY *pEVar31;
  X509 *pXVar32;
  GENERAL_NAMES *a_00;
  int *piVar33;
  char **__s;
  X509 *pXVar34;
  undefined8 extraout_RAX;
  PKCS12 *p12;
  X509 *pXVar35;
  X509_NAME_ENTRY *ne;
  void *__src;
  size_t uznum;
  Curl_easy *resp;
  OCSP_BASICRESP *bs;
  stack_st_X509 *certs;
  X509_STORE *pXVar36;
  OCSP_SINGLERESP *single;
  X509_PUBKEY *pXVar37;
  SSL_SESSION *pSVar38;
  evp_pkey_st *peVar39;
  rsa_st *r;
  UI_METHOD *method;
  UI_METHOD *pUVar40;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  SSL *pSVar41;
  long lVar42;
  undefined7 uVar44;
  ssl_connect_data *psVar43;
  curl_socket_t writefd;
  long lVar45;
  size_t size;
  size_t size_00;
  long lVar46;
  Curl_easy *pCVar47;
  CURLcode CVar48;
  ssl_connect_data *unaff_RBP;
  long lVar49;
  char cVar50;
  curl_socket_t readfd0;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  ulong uVar55;
  ulong uVar56;
  byte bVar57;
  char *pcVar58;
  bool bVar59;
  BUF_MEM *biomem;
  char *ptr;
  X509_ALGOR *palg;
  ASN1_BIT_STRING *psig;
  int crl_reason;
  EVP_PKEY *pri;
  in6_addr addr;
  char error_buffer [256];
  char **local_a88;
  SSL_SESSION *local_a78;
  Curl_easy *local_a70;
  ASN1_GENERALIZEDTIME *local_a68;
  Curl_easy *local_a60;
  X509 *local_a58;
  long local_a50;
  SSL_SESSION *local_a48;
  Curl_easy *local_a40;
  X509 *local_a38;
  X509 *local_a30;
  Curl_easy *local_a28;
  ssl_connect_data *local_a20;
  char *local_a18;
  undefined8 local_a10;
  ssl_connect_data *local_a08;
  ASN1_GENERALIZEDTIME *local_a00;
  uint local_9f4;
  X509 *local_9f0;
  char *local_9e8;
  long local_9e0;
  char *local_9d8;
  _Bool *local_9d0;
  Curl_easy *local_9c8;
  char *local_9c0;
  SSL_SESSION *local_9b8 [16];
  X509 *local_938;
  X509 *local_930;
  X509 local_838 [2];
  undefined1 local_638 [1544];
  
  lVar14 = (long)sockindex;
  if (conn->ssl[lVar14].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  pCVar47 = conn->data;
  local_a30 = (X509 *)CONCAT44(local_a30._4_4_,conn->sock[lVar14]);
  local_a70 = pCVar47;
  local_9e0 = lVar14;
  local_9d0 = done;
  if (conn->ssl[lVar14].connecting_state == ssl_connect_1) {
    tVar19 = Curl_timeleft(pCVar47,(curltime *)0x0,true);
    if (tVar19 < 0) {
LAB_0049b4d6:
      Curl_failf(pCVar47,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    cVar2 = (conn->http_proxy).proxytype;
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar46 = 0x160, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar46 = 0xd0;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar17 = 0xb40, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar17 = 0xa98;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar45 = 0x358, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar45 = 0x308;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar49 = 0xb68, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar49 = 0xac0;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar51 = 0xb70, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar51 = 0xac8;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar52 = 0x370, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar52 = 800;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar53 = 0x368, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar53 = 0x318;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar54 = 0x3a0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar54 = 0x350;
    }
    local_a28 = (Curl_easy *)CONCAT44(local_a28._4_4_,sockindex);
    pCVar47 = conn->data;
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar42 = 0xb48, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar42 = 0xaa0;
    }
    local_a60 = (Curl_easy *)
                CONCAT44(local_a60._4_4_,(uint)(byte)(conn->chunk).hexbuffer[lVar54 + -0x20]);
    local_a10 = CONCAT44(local_a10._4_4_,conn->sock[local_9e0]);
    local_9e8 = *(char **)((conn->chunk).hexbuffer + lVar46 + -0x20);
    uVar16 = *(ulong *)((conn->chunk).hexbuffer + lVar45 + -0x20);
    local_a58 = *(X509 **)((long)&pCVar47->next + lVar49);
    local_a38 = *(X509 **)((long)&pCVar47->next + lVar51);
    pcVar58 = *(char **)((conn->chunk).hexbuffer + lVar52 + -0x20);
    unaff_RBP = *(ssl_connect_data **)((conn->chunk).hexbuffer + lVar53 + -0x20);
    pXVar24 = *(X509 **)((long)&pCVar47->next + lVar42);
    local_a50 = lVar14 * 3;
    CVar10 = Curl_ossl_seed(pCVar47);
    if (CVar10 != CURLE_OK) goto LAB_0049b4c4;
    *(undefined8 *)((long)&pCVar47->next + lVar17) = 1;
    local_a20 = unaff_RBP;
    local_a18 = pcVar58;
    local_9f0 = pXVar24;
    if (uVar16 < 8) {
      if ((0xf3UL >> (uVar16 & 0x3f) & 1) == 0) {
        if (uVar16 == 2) {
          pcVar58 = "OpenSSL was built without SSLv2 support";
        }
        else {
          pcVar58 = "OpenSSL was built without SSLv3 support";
        }
        Curl_failf(pCVar47,pcVar58);
        CVar10 = CURLE_NOT_BUILT_IN;
        goto LAB_0049b4c4;
      }
      meth = (SSL_METHOD *)TLS_client_method();
      pSVar20 = (SSL_CTX *)(conn->ssl[lVar14].backend)->ctx;
      if (pSVar20 != (SSL_CTX *)0x0) {
        SSL_CTX_free(pSVar20);
      }
      pSVar20 = SSL_CTX_new(meth);
      pXVar24 = local_a58;
      (conn->ssl[lVar14].backend)->ctx = (SSL_CTX *)pSVar20;
      if (pSVar20 == (SSL_CTX *)0x0) {
        uVar16 = ERR_peek_error();
        ERR_error_string_n(uVar16,(char *)local_838,0x100);
        Curl_failf(pCVar47,"SSL: couldn\'t create a context: %s",local_838);
LAB_0049b794:
        CVar10 = CURLE_OUT_OF_MEMORY;
      }
      else {
        SSL_CTX_ctrl(pSVar20,0x21,0x10,(void *)0x0);
        if (((pCVar47->set).fdebug != (curl_debug_callback)0x0) &&
           (((pCVar47->set).field_0x87b & 0x40) != 0)) {
          SSL_CTX_set_msg_callback((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx,ssl_tls_trace);
          SSL_CTX_ctrl((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx,0x10,0,conn);
        }
        uVar55 = 0x80024850;
        cVar2 = (conn->http_proxy).proxytype;
        if ((cVar2 == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          bVar6 = (pCVar47->set).proxy_ssl.field_0xa0;
        }
        else {
          bVar6 = (pCVar47->set).ssl.field_0xa0;
        }
        if ((bVar6 & 4) == 0) {
          uVar55 = 0x80024050;
        }
        if (7 < uVar16) goto LAB_0049c31a;
        if ((0xf3UL >> (uVar16 & 0x3f) & 1) == 0) {
          if (uVar16 == 2) {
            uVar16 = uVar55 | 0x3e000000;
          }
          else {
            uVar16 = uVar55 | 0x3c000000;
          }
        }
        else {
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar46 = 0x358, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar46 = 0x308;
          }
          lVar46 = *(long *)((conn->chunk).hexbuffer + lVar46 + -0x20);
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar17 = 0x360, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar17 = 0x310;
          }
          uVar16 = uVar55 | 0x2000000;
          lVar17 = *(long *)((conn->chunk).hexbuffer + lVar17 + -0x20);
          if (lVar46 == 5) {
LAB_0049b723:
            uVar16 = uVar16 | 0x4000000;
          }
          else {
            if (lVar46 == 6) {
LAB_0049b71c:
              uVar16 = uVar16 | 0x10000000;
              goto LAB_0049b723;
            }
            if (lVar46 == 7) {
              SSL_CTX_ctrl((SSL_CTX *)(&conn->ssl[0].backend)[local_a50]->ctx,0x7c,0x304,(void *)0x0
                          );
              uVar16 = uVar55 | 0xa000000;
              goto LAB_0049b71c;
            }
          }
          if (lVar17 != 0x60000) {
            if (lVar17 != 0x50000) {
              if (lVar17 != 0x40000) goto LAB_0049c6de;
              uVar16 = uVar16 | 0x10000000;
            }
            uVar16 = uVar16 | 0x8000000;
          }
          uVar16 = uVar16 | 0x20000000;
        }
LAB_0049c6de:
        SSL_CTX_set_options((conn->ssl[lVar14].backend)->ctx,uVar16);
        if (((conn->bits).field_0x7 & 0x10) != 0) {
          SSL_CTX_set_next_proto_select_cb
                    ((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx,select_next_proto_cb,conn);
        }
        if (((conn->bits).field_0x7 & 0x20) != 0) {
          local_838[0].cert_info._0_1_ = 8;
          local_838[0].cert_info._1_7_ = 0x2e312f70747468;
          local_838[0].sig_alg._0_1_ = 0x31;
          Curl_infof(pCVar47,"ALPN, offering %s\n","http/1.1");
          SSL_CTX_set_alpn_protos((conn->ssl[lVar14].backend)->ctx,local_838,9);
        }
        psVar43 = unaff_RBP;
        if (pXVar24 != (X509 *)0x0 || local_a38 != (X509 *)0x0) {
          cVar2 = (conn->http_proxy).proxytype;
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar46 = 0xb78, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar46 = 0xad0;
          }
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar17 = 0xb80, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar17 = 0xad8;
          }
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar45 = 0xb88, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar45 = 0xae0;
          }
          pSVar20 = (SSL_CTX *)(conn->ssl[lVar14].backend)->ctx;
          pXVar34 = *(X509 **)((long)&pCVar47->next + lVar46);
          local_9d8 = *(char **)((long)&pCVar47->next + lVar17);
          uVar16 = (ulong)unaff_RBP >> 8;
          unaff_RBP = *(ssl_connect_data **)((long)&pCVar47->next + lVar45);
          local_a40 = conn->data;
          local_9c8 = pCVar47;
          iVar8 = do_file_type((char *)local_a38);
          psVar43 = (ssl_connect_data *)CONCAT71((int7)uVar16,pXVar24 != (X509 *)0x0);
          pCVar47 = local_9c8;
          if (iVar8 == 0x2a || pXVar24 != (X509 *)0x0) {
            if (unaff_RBP != (ssl_connect_data *)0x0) {
              SSL_CTX_set_default_passwd_cb_userdata(pSVar20,unaff_RBP);
              SSL_CTX_set_default_passwd_cb(pSVar20,passwd_callback);
            }
            pCVar47 = local_a40;
            if (iVar8 < 0x2a) {
              if (iVar8 == 1) {
                iVar11 = SSL_CTX_use_certificate_chain_file(pSVar20,(char *)pXVar24);
                psVar43 = unaff_RBP;
                if (iVar11 != 1) {
                  uVar16 = ERR_get_error();
                  ERR_error_string_n(uVar16,(char *)local_838,0x100);
                  pcVar58 = 
                  "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                  ;
                  goto LAB_0049cd3f;
                }
LAB_0049cb5e:
                local_a08 = psVar43;
                unaff_RBP = (ssl_connect_data *)0x0;
LAB_0049d702:
                if (pXVar34 != (X509 *)0x0) {
                  iVar8 = do_file_type(local_9d8);
                  pXVar24 = pXVar34;
                }
                if (iVar8 < 0x2a) {
                  if (iVar8 == 1) {
                    if ((int)unaff_RBP != 0) goto LAB_0049d770;
                  }
                  else if (iVar8 != 2) goto LAB_0049d748;
                  iVar8 = SSL_CTX_use_PrivateKey_file(pSVar20,(char *)pXVar24,iVar8);
                  if (iVar8 != 1) {
                    pcVar58 = "unable to set private key file: \'%s\' type %s";
LAB_0049d9af:
                    Curl_failf(pCVar47,pcVar58,pXVar24);
                    goto LAB_0049da7e;
                  }
                }
                else {
                  if (iVar8 == 0x2a) {
                    if (((pXVar24 != (X509 *)0x0) && ((pCVar47->state).engine == (void *)0x0)) &&
                       (iVar8 = Curl_strncasecompare((char *)pXVar24,"pkcs11:",7), iVar8 != 0)) {
                      CVar10 = Curl_ossl_set_engine(pCVar47,"pkcs11");
                      iVar11 = 1;
                      if (CVar10 != CURLE_OK) goto LAB_0049da84;
                    }
                    if ((pCVar47->state).engine == (void *)0x0) {
                      pcVar58 = "crypto engine not set, can\'t load private key";
                    }
                    else {
                      method = UI_create_method("curl user interface");
                      if (method == (UI_METHOD *)0x0) {
                        pcVar58 = "unable do create OpenSSL user-interface method";
                      }
                      else {
                        pUVar40 = UI_OpenSSL();
                        iVar8 = UI_method_get_opener((UI *)pUVar40);
                        UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar8));
                        pUVar40 = UI_OpenSSL();
                        iVar8 = UI_method_get_closer((UI *)pUVar40);
                        UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar8));
                        UI_method_set_reader(method,ssl_ui_reader);
                        UI_method_set_writer(method,ssl_ui_writer);
                        pEVar31 = ENGINE_load_private_key
                                            ((ENGINE *)(pCVar47->state).engine,(char *)pXVar24,
                                             method,local_a08);
                        UI_destroy_method(method);
                        if (pEVar31 != (EVP_PKEY *)0x0) {
                          iVar8 = SSL_CTX_use_PrivateKey(pSVar20,pEVar31);
                          if (iVar8 != 1) {
                            Curl_failf(local_a40,"unable to set private key");
                            EVP_PKEY_free(pEVar31);
                            goto LAB_0049da7e;
                          }
                          EVP_PKEY_free(pEVar31);
                          pCVar47 = local_a40;
                          goto LAB_0049d770;
                        }
                        pcVar58 = "failed to load private key from crypto engine";
                        pCVar47 = local_a40;
                      }
                    }
                    goto LAB_0049da77;
                  }
                  if (iVar8 != 0x2b) {
LAB_0049d748:
                    pcVar58 = "not supported file type for private key";
                    goto LAB_0049da77;
                  }
                  if ((int)unaff_RBP == 0) {
                    pcVar58 = "file type P12 for private key not supported";
                    goto LAB_0049da77;
                  }
                }
LAB_0049d770:
                pSVar41 = SSL_new(pSVar20);
                if (pSVar41 == (SSL *)0x0) {
                  pcVar58 = "unable to create an SSL structure";
                  goto LAB_0049da77;
                }
                local_938 = SSL_get_certificate(pSVar41);
                if (local_938 != (X509 *)0x0) {
                  pEVar31 = X509_get_pubkey(local_938);
                  peVar39 = SSL_get_privatekey(pSVar41);
                  EVP_PKEY_copy_parameters(pEVar31,peVar39);
                  EVP_PKEY_free(pEVar31);
                }
                peVar39 = SSL_get_privatekey(pSVar41);
                iVar8 = EVP_PKEY_get_id(peVar39);
                if (iVar8 == 6) {
                  r = EVP_PKEY_get1_RSA(peVar39);
                  uVar9 = RSA_flags(r);
                  unaff_RBP = (ssl_connect_data *)(ulong)uVar9;
                  RSA_free(r);
                  SSL_free(pSVar41);
                  if ((uVar9 & 1) == 0) goto LAB_0049d958;
                }
                else {
                  SSL_free(pSVar41);
LAB_0049d958:
                  iVar8 = SSL_CTX_check_private_key(pSVar20);
                  if (iVar8 == 0) {
                    pcVar58 = "Private key does not match the certificate public key";
                    goto LAB_0049da77;
                  }
                }
                iVar11 = 0;
              }
              else {
                if (iVar8 == 2) {
                  iVar11 = SSL_CTX_use_certificate_file(pSVar20,(char *)pXVar24,2);
                  psVar43 = unaff_RBP;
                  if (iVar11 == 1) goto LAB_0049cb5e;
                  uVar16 = ERR_get_error();
                  ERR_error_string_n(uVar16,(char *)local_838,0x100);
                  pcVar58 = 
                  "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                  ;
LAB_0049cd3f:
                  pXVar24 = local_838;
                }
                else {
LAB_0049cb31:
                  pcVar58 = "not supported file type \'%s\' for certificate";
                  pXVar24 = local_a38;
                }
                Curl_failf(pCVar47,pcVar58,pXVar24);
LAB_0049da7e:
                iVar11 = 1;
              }
            }
            else {
              if (iVar8 == 0x2a) {
                local_a08 = unaff_RBP;
                if (((pXVar24 != (X509 *)0x0) && ((local_a40->state).engine == (void *)0x0)) &&
                   (iVar11 = Curl_strncasecompare((char *)pXVar24,"pkcs11:",7), iVar11 != 0)) {
                  CVar10 = Curl_ossl_set_engine(pCVar47,"pkcs11");
                  iVar11 = 1;
                  if (CVar10 != CURLE_OK) goto LAB_0049da84;
                }
                e = (ENGINE *)(pCVar47->state).engine;
                if (e == (ENGINE *)0x0) {
                  pcVar58 = "crypto engine not set, can\'t load certificate";
                }
                else {
                  local_938 = pXVar24;
                  local_930 = (X509 *)0x0;
                  iVar11 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
                  if (iVar11 == 0) {
                    pcVar58 = "ssl engine does not support loading certificates";
                  }
                  else {
                    iVar11 = ENGINE_ctrl_cmd((ENGINE *)(pCVar47->state).engine,"LOAD_CERT_CTRL",0,
                                             &local_938,(f *)0x0,1);
                    if (iVar11 == 0) {
                      uVar16 = ERR_get_error();
                      ERR_error_string_n(uVar16,(char *)local_838,0x100);
                      pcVar58 = "ssl engine cannot load client cert with id \'%s\' [%s]";
                      goto LAB_0049d9af;
                    }
                    if (local_930 != (X509 *)0x0) {
                      iVar11 = SSL_CTX_use_certificate(pSVar20,local_930);
                      if (iVar11 == 1) {
                        X509_free(local_930);
                        psVar43 = local_a08;
                        goto LAB_0049cb5e;
                      }
                      Curl_failf(pCVar47,"unable to set client certificate");
                      X509_free(local_930);
                      goto LAB_0049da7e;
                    }
                    pcVar58 = "ssl engine didn\'t initialized the certificate properly.";
                  }
                }
LAB_0049da77:
                Curl_failf(pCVar47,pcVar58);
                goto LAB_0049da7e;
              }
              if (iVar8 != 0x2b) goto LAB_0049cb31;
              local_a78 = (SSL_SESSION *)0x0;
              pBVar21 = BIO_s_file();
              pBVar23 = BIO_new(pBVar21);
              if (pBVar23 == (BIO *)0x0) {
                local_a08 = unaff_RBP;
                uVar16 = ERR_get_error();
                pXVar35 = local_838;
                ERR_error_string_n(uVar16,(char *)pXVar35,0x100);
                pcVar58 = "BIO_new return NULL, OpenSSL error %s";
LAB_0049d6eb:
                Curl_failf(pCVar47,pcVar58,pXVar35);
LAB_0049d6f2:
                unaff_RBP = (ssl_connect_data *)0x0;
                iVar11 = 1;
              }
              else {
                local_a08 = unaff_RBP;
                lVar46 = BIO_ctrl(pBVar23,0x6c,3,pXVar24);
                if ((int)lVar46 < 1) {
                  Curl_failf(pCVar47,"could not open PKCS12 file \'%s\'",pXVar24);
                  BIO_free(pBVar23);
                  goto LAB_0049d6f2;
                }
                p12 = d2i_PKCS12_bio(pBVar23,(PKCS12 **)0x0);
                BIO_free(pBVar23);
                if (p12 == (PKCS12 *)0x0) {
                  pcVar58 = "error reading PKCS12 file \'%s\'";
                  pXVar35 = pXVar24;
                  goto LAB_0049d6eb;
                }
                PKCS12_PBE_add();
                iVar11 = PKCS12_parse(p12,(char *)local_a08,(EVP_PKEY **)local_9b8,&local_938,
                                      (stack_st_X509 **)&local_a78);
                if (iVar11 == 0) {
                  uVar16 = ERR_get_error();
                  ERR_error_string_n(uVar16,(char *)local_838,0x100);
                  Curl_failf(pCVar47,"could not parse PKCS12 file, check password, OpenSSL error %s"
                             ,local_838);
                  PKCS12_free(p12);
                  goto LAB_0049d6f2;
                }
                PKCS12_free(p12);
                iVar11 = SSL_CTX_use_certificate(pSVar20,local_938);
                if (iVar11 == 1) {
                  iVar11 = SSL_CTX_use_PrivateKey(pSVar20,(EVP_PKEY *)local_9b8[0]);
                  if (iVar11 != 1) {
                    pcVar58 = "unable to use private key from PKCS12 file \'%s\'";
                    pXVar35 = local_a58;
                    pXVar24 = local_a58;
                    pCVar47 = local_a40;
                    goto LAB_0049e15a;
                  }
                  iVar11 = SSL_CTX_check_private_key(pSVar20);
                  pCVar47 = local_a40;
                  pXVar24 = local_a58;
                  if (iVar11 == 0) {
                    pcVar58 = 
                    "private key from PKCS12 file \'%s\' does not match certificate in same file";
                    pXVar35 = local_a58;
                    goto LAB_0049e15a;
                  }
                  if (local_a78 == (SSL_SESSION *)0x0) {
                    uVar16 = 0;
                    goto LAB_0049e164;
                  }
                  do {
                    iVar11 = OPENSSL_sk_num(local_a78);
                    uVar16 = (ulong)(iVar11 != 0);
                    if (iVar11 == 0) goto LAB_0049e164;
                    pXVar35 = (X509 *)OPENSSL_sk_pop(local_a78);
                    iVar11 = SSL_CTX_add_client_CA(pSVar20,pXVar35);
                    pcVar58 = "cannot add certificate to client CA list";
                    if (iVar11 == 0) {
LAB_0049ca54:
                      X509_free(pXVar35);
                      Curl_failf(pCVar47,pcVar58);
                      iVar11 = 3;
                    }
                    else {
                      iVar11 = 0;
                      lVar46 = SSL_CTX_ctrl(pSVar20,0xe,0,pXVar35);
                      pcVar58 = "cannot add certificate to certificate chain";
                      if (lVar46 == 0) goto LAB_0049ca54;
                    }
                  } while (iVar11 == 0);
                  uVar16 = 1;
                  if (iVar11 == 3) goto LAB_0049e164;
                  unaff_RBP = (ssl_connect_data *)0x0;
                }
                else {
                  uVar16 = ERR_get_error();
                  ERR_error_string_n(uVar16,(char *)local_838,0x100);
                  pcVar58 = "could not load PKCS12 client certificate, OpenSSL error %s";
                  pXVar35 = local_838;
LAB_0049e15a:
                  Curl_failf(pCVar47,pcVar58,pXVar35);
                  uVar16 = 1;
LAB_0049e164:
                  EVP_PKEY_free((EVP_PKEY *)local_9b8[0]);
                  X509_free(local_938);
                  OPENSSL_sk_pop_free(local_a78);
                  iVar11 = 2 - (int)uVar16;
                  unaff_RBP = (ssl_connect_data *)(uVar16 ^ 1);
                }
              }
              if (iVar11 == 2) goto LAB_0049d702;
            }
LAB_0049da84:
            psVar43 = unaff_RBP;
            pCVar47 = local_9c8;
            if (iVar11 != 0) {
              CVar10 = CURLE_SSL_CERTPROBLEM;
              goto LAB_0049b4c4;
            }
          }
        }
        unaff_RBP = psVar43;
        if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
           (lVar46 = 0x390, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar46 = 0x340;
        }
        pcVar58 = *(char **)((conn->chunk).hexbuffer + lVar46 + -0x20);
        if (pcVar58 == (char *)0x0) {
LAB_0049db08:
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar46 = 0x398, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar46 = 0x348;
          }
          pcVar58 = *(char **)((conn->chunk).hexbuffer + lVar46 + -0x20);
          if (pcVar58 != (char *)0x0) {
            iVar8 = SSL_CTX_set_ciphersuites((conn->ssl[lVar14].backend)->ctx,pcVar58);
            if (iVar8 == 0) {
              pcVar18 = "failed setting TLS 1.3 cipher suite: %s";
              goto LAB_0049dc0a;
            }
            Curl_infof(pCVar47,"TLS 1.3 cipher selection: %s\n",pcVar58);
          }
          uVar9 = (uint)local_a60 & 1;
          SSL_CTX_set_post_handshake_auth((conn->ssl[lVar14].backend)->ctx,1);
          if (local_a18 != (char *)0x0 || local_a20 != (ssl_connect_data *)0x0) {
            iVar8 = SSL_CTX_load_verify_locations
                              ((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx,local_a18,
                               (char *)local_a20);
            if ((iVar8 == 0) && ((char)uVar9 != '\0')) {
              pcVar58 = local_a18;
              if (local_a18 == (char *)0x0) {
                pcVar58 = "none";
              }
              psVar43 = (ssl_connect_data *)0x51fe33;
              if (local_a20 != (ssl_connect_data *)0x0) {
                psVar43 = local_a20;
              }
              Curl_failf(pCVar47,
                         "error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s",
                         pcVar58,psVar43);
              CVar10 = CURLE_SSL_CACERT_BADFILE;
              goto LAB_0049b4c4;
            }
            pcVar58 = "error setting certificate verify locations, continuing anyway:\n";
            if (iVar8 != 0) {
              pcVar58 = "successfully set certificate verify locations:\n";
            }
            Curl_infof(pCVar47,pcVar58);
            pcVar58 = local_a18;
            if (local_a18 == (char *)0x0) {
              pcVar58 = "none";
            }
            Curl_infof(pCVar47,"  CAfile: %s\n  CApath: %s\n",pcVar58);
          }
          if (local_9f0 != (X509 *)0x0) {
            unaff_RBP = (ssl_connect_data *)(ulong)uVar9;
            pXVar36 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx);
            m = X509_LOOKUP_file();
            ctx = X509_STORE_add_lookup(pXVar36,m);
            pXVar24 = local_9f0;
            if ((ctx == (X509_LOOKUP *)0x0) ||
               (iVar8 = X509_load_crl_file(ctx,(char *)local_9f0,1), iVar8 == 0)) {
              Curl_failf(pCVar47,"error loading CRL file: %s",pXVar24);
              CVar10 = CURLE_SSL_CRL_BADFILE;
              goto LAB_0049b4c4;
            }
            Curl_infof(pCVar47,"successfully load CRL file:\n");
            pXVar36 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx);
            X509_STORE_set_flags(pXVar36,0xc);
            Curl_infof(pCVar47,"  CRLfile: %s\n",pXVar24);
          }
          SSL_CTX_set_verify((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx,uVar9,(callback *)0x0);
          if (keylog_file_fp != (FILE *)0x0) {
            SSL_CTX_set_keylog_callback((conn->ssl[lVar14].backend)->ctx,ossl_keylog_callback);
          }
          SSL_CTX_ctrl((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx,0x2c,0x301,(void *)0x0);
          SSL_CTX_sess_set_new_cb((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx,ossl_new_session_cb);
          p_Var5 = (pCVar47->set).ssl.fsslctx;
          if ((p_Var5 == (curl_ssl_ctx_callback)0x0) ||
             (CVar10 = (*p_Var5)(pCVar47,(conn->ssl[lVar14].backend)->ctx,
                                 (pCVar47->set).ssl.fsslctxp), CVar10 == CURLE_OK)) {
            pSVar41 = (SSL *)(conn->ssl[lVar14].backend)->handle;
            if (pSVar41 != (SSL *)0x0) {
              SSL_free(pSVar41);
            }
            pSVar41 = SSL_new((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx);
            (conn->ssl[lVar14].backend)->handle = (SSL *)pSVar41;
            if (pSVar41 == (SSL *)0x0) {
              Curl_failf(pCVar47,"SSL: couldn\'t create a context (handle)!");
              goto LAB_0049b794;
            }
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              bVar6 = (conn->proxy_ssl_config).field_0x48;
            }
            else {
              bVar6 = (conn->ssl_config).field_0x48;
            }
            if ((bVar6 & 4) != 0) {
              SSL_ctrl(pSVar41,0x41,1,(void *)0x0);
            }
            SSL_set_connect_state((SSL *)(conn->ssl[lVar14].backend)->handle);
            pcVar58 = local_9e8;
            (conn->ssl[lVar14].backend)->server_cert = (X509 *)0x0;
            iVar8 = inet_pton(2,local_9e8,&local_938);
            if (((iVar8 == 0) && (iVar8 = inet_pton(10,pcVar58,&local_938), iVar8 == 0)) &&
               (lVar46 = SSL_ctrl((SSL *)(conn->ssl[lVar14].backend)->handle,0x37,0,pcVar58),
               lVar46 == 0)) {
              Curl_infof(pCVar47,
                         "WARNING: failed to configure server name indication (SNI) TLS extension\n"
                        );
            }
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              bVar6 = (pCVar47->set).proxy_ssl.primary.field_0x48;
            }
            else {
              bVar6 = (pCVar47->set).ssl.primary.field_0x48;
            }
            if ((bVar6 & 8) != 0) {
              local_9b8[0] = (SSL_SESSION *)0x0;
              uVar9 = ossl_get_ssl_conn_index();
              uVar13 = ossl_get_ssl_sockindex_index();
              if (-1 < (int)(uVar9 | uVar13)) {
                SSL_set_ex_data((SSL *)(conn->ssl[lVar14].backend)->handle,uVar9,conn);
                SSL_set_ex_data((SSL *)(conn->ssl[lVar14].backend)->handle,uVar13,
                                conn->sock + local_9e0);
                unaff_RBP = conn->ssl + lVar14;
              }
              Curl_ssl_sessionid_lock(conn);
              _Var7 = Curl_ssl_getsessionid(conn,local_9b8,(size_t *)0x0,(int)local_a28);
              if (_Var7) {
LAB_0049dfed:
                Curl_ssl_sessionid_unlock(conn);
                CVar10 = CURLE_SSL_CIPHER;
                unaff_RBP = (ssl_connect_data *)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
              }
              else {
                iVar8 = SSL_set_session((SSL *)(conn->ssl[lVar14].backend)->handle,local_9b8[0]);
                if (iVar8 != 0) {
                  Curl_infof(pCVar47,"SSL re-using session ID\n");
                  goto LAB_0049dfed;
                }
                Curl_ssl_sessionid_unlock(conn);
                uVar16 = ERR_get_error();
                ERR_error_string_n(uVar16,(char *)local_838,0x100);
                unaff_RBP = (ssl_connect_data *)0x0;
                Curl_failf(pCVar47,"SSL: SSL_set_session failed: %s",local_838);
                CVar10 = CURLE_SSL_CONNECT_ERROR;
              }
              if ((char)unaff_RBP == '\0') goto LAB_0049b4c4;
            }
            lVar46 = local_a50;
            if (((&conn->proxy_ssl[0].field_0x10)[local_a50 * 8] & 1) == 0) {
              iVar8 = SSL_set_fd((SSL *)(conn->ssl[lVar14].backend)->handle,(int)local_a10);
              if (iVar8 == 0) {
                uVar16 = ERR_get_error();
                ERR_error_string_n(uVar16,(char *)local_838,0x100);
                Curl_failf(pCVar47,"SSL: SSL_set_fd failed: %s",local_838);
                goto LAB_0049c32b;
              }
            }
            else {
              pBVar21 = BIO_f_ssl();
              pBVar23 = BIO_new(pBVar21);
              BIO_ctrl(pBVar23,0x6d,0,(&conn->proxy_ssl[0].backend)[lVar46]->handle);
              SSL_set_bio((SSL *)(conn->ssl[lVar14].backend)->handle,pBVar23,pBVar23);
            }
            conn->ssl[lVar14].connecting_state = ssl_connect_2;
            CVar10 = CURLE_OK;
          }
          else {
            Curl_failf(pCVar47,"error signaled by ssl ctx callback");
          }
        }
        else {
          iVar8 = SSL_CTX_set_cipher_list((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx,pcVar58);
          if (iVar8 != 0) {
            Curl_infof(pCVar47,"Cipher selection: %s\n",pcVar58);
            goto LAB_0049db08;
          }
          pcVar18 = "failed setting cipher list: %s";
LAB_0049dc0a:
          Curl_failf(pCVar47,pcVar18,pcVar58);
          CVar10 = CURLE_SSL_CIPHER;
        }
      }
    }
    else {
LAB_0049c31a:
      Curl_failf(pCVar47,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
LAB_0049c32b:
      CVar10 = CURLE_SSL_CONNECT_ERROR;
    }
LAB_0049b4c4:
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
  }
  local_a58 = (X509 *)&(conn->http_proxy).host.name;
  while (pCVar47 = local_a70, sVar1 = conn->ssl[lVar14].connecting_state, sVar1 - ssl_connect_2 < 3)
  {
    timeout_ms = Curl_timeleft(local_a70,(curltime *)0x0,true);
    if (timeout_ms < 0) goto LAB_0049b4d6;
    sVar1 = conn->ssl[lVar14].connecting_state;
    if ((sVar1 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar1 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_a30;
      }
      readfd0 = -1;
      if (sVar1 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_a30;
      }
      if (nonblocking) {
        timeout_ms = 0;
      }
      iVar8 = Curl_socket_check(readfd0,-1,writefd,timeout_ms);
      if (iVar8 < 0) {
        puVar15 = (uint *)__errno_location();
        bVar59 = false;
        Curl_failf(pCVar47,"select/poll on SSL socket, errno: %d",(ulong)*puVar15);
        unaff_RBP = (ssl_connect_data *)0x23;
      }
      else {
        bVar59 = true;
        if (iVar8 == 0) {
          if (nonblocking) {
            *local_9d0 = false;
            bVar59 = false;
            unaff_RBP = (ssl_connect_data *)0x0;
          }
          else {
            bVar59 = false;
            Curl_failf(pCVar47,"SSL connection timeout");
            unaff_RBP = (ssl_connect_data *)0x1c;
          }
        }
      }
      if (!bVar59) {
        return (CURLcode)unaff_RBP;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar46 = 0xb40, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar46 = 0xa98;
    }
    pCVar47 = conn->data;
    ERR_clear_error();
    iVar8 = SSL_connect((SSL *)(conn->ssl[lVar14].backend)->handle);
    if (iVar8 == 1) {
      conn->ssl[lVar14].connecting_state = ssl_connect_3;
      pSVar41 = (SSL *)(conn->ssl[lVar14].backend)->handle;
      pcVar58 = "";
      if (pSVar41 != (SSL *)0x0) {
        iVar8 = SSL_version(pSVar41);
        pcVar58 = "TLSv1.3";
        switch(iVar8) {
        case 0x300:
          pcVar58 = "SSLv3";
          break;
        case 0x301:
          pcVar58 = "TLSv1.0";
          break;
        case 0x302:
          pcVar58 = "TLSv1.1";
          break;
        case 0x303:
          pcVar58 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar8 == 2) {
            pcVar58 = "SSLv2";
          }
          else {
            pcVar58 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)(conn->ssl[lVar14].backend)->handle);
      pcVar18 = SSL_CIPHER_get_name(c);
      CVar10 = CURLE_OK;
      Curl_infof(pCVar47,"SSL connection using %s / %s\n",pcVar58,pcVar18);
      if (((conn->bits).field_0x7 & 0x20) != 0) {
        SSL_get0_alpn_selected((conn->ssl[lVar14].backend)->handle,local_838,&local_938);
        if ((int)local_938 == 0) {
          Curl_infof(pCVar47,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar47,"ALPN, server accepted to use %.*s\n",(ulong)local_938 & 0xffffffff,
                     CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_));
          if (((int)local_938 == 8) &&
             (*(long *)CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_) ==
              0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
        Curl_multiuse_state(conn,(uint)(conn->negnpn == 3) * 3 + -1);
      }
    }
    else {
      uVar9 = SSL_get_error((SSL *)(conn->ssl[lVar14].backend)->handle,iVar8);
      if (uVar9 == 9) {
        conn->ssl[lVar14].connecting_state = ssl_connect_2;
      }
      else if (uVar9 == 3) {
        conn->ssl[lVar14].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (uVar9 != 2) {
          memset(local_838,0,0x100);
          conn->ssl[lVar14].connecting_state = ssl_connect_2;
          uVar16 = ERR_get_error();
          uVar13 = (uint)uVar16;
          if ((((int)uVar13 < 0) || ((uVar13 & 0xff800000) != 0xa000000)) ||
             ((uVar13 & 0x7fffff) != 0x86)) {
            ERR_error_string_n(uVar16,(char *)local_838,0x100);
            CVar10 = CURLE_SSL_CONNECT_ERROR;
          }
          else {
            lVar17 = SSL_get_verify_result((SSL *)(conn->ssl[lVar14].backend)->handle);
            if (lVar17 == 0) {
              local_838[0].signature = (ASN1_BIT_STRING *)0x6163696669726576;
              local_838[0]._24_8_ = 0x696166206e6f6974;
              local_838[0].cert_info._0_1_ = 0x53;
              local_838[0].cert_info._1_7_ = 0x74726563204c53;
              local_838[0].sig_alg._0_1_ = 0x69;
              local_838[0].sig_alg._1_7_ = 0x20657461636966;
              local_838[0].name._0_4_ = 0x64656c;
            }
            else {
              *(long *)((long)&pCVar47->next + lVar46) = lVar17;
              pcVar58 = X509_verify_cert_error_string(lVar17);
              curl_msnprintf((char *)local_838,0x100,"SSL certificate problem: %s",pcVar58);
            }
            CVar10 = CURLE_PEER_FAILED_VERIFICATION;
          }
          if (uVar16 == 0) {
            cVar2 = (conn->http_proxy).proxytype;
            if ((cVar2 != CURLPROXY_HTTPS) ||
               (pXVar24 = local_a58,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              pXVar24 = (X509 *)&(conn->host).name;
            }
            if ((cVar2 == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              lVar46 = conn->port;
            }
            else {
              lVar46 = (long)conn->remote_port;
            }
            pcVar58 = "SSL_ERROR unknown";
            if (uVar9 < 0xb) {
              pcVar58 = (&PTR_anon_var_dwarf_17d475a_00631698)[uVar9];
            }
            Curl_failf(pCVar47,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar58,
                       *(char **)pXVar24,lVar46);
          }
          else {
            Curl_failf(pCVar47,"%s",local_838);
          }
          goto LAB_0049b178;
        }
        conn->ssl[lVar14].connecting_state = ssl_connect_2_reading;
      }
      CVar10 = CURLE_OK;
    }
LAB_0049b178:
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    if ((nonblocking) && (conn->ssl[lVar14].connecting_state - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar1 != ssl_connect_3) goto LAB_0049d64e;
  cVar2 = (conn->http_proxy).proxytype;
  if ((cVar2 == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    bVar6 = (conn->proxy_ssl_config).field_0x48;
  }
  else {
    bVar6 = (conn->ssl_config).field_0x48;
  }
  bVar57 = 1;
  if ((bVar6 & 1) == 0) {
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar46 = 0x3a0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar46 = 0x350;
    }
    bVar57 = ((conn->chunk).hexbuffer[lVar46 + -0x20] & 2U) >> 1;
  }
  local_a50 = CONCAT71(local_a50._1_7_,bVar57);
  pCVar47 = conn->data;
  memset(&local_938,0,0x100);
  if ((cVar2 != CURLPROXY_HTTPS) ||
     (local_9e8 = (char *)0xb40,
     conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
    local_9e8 = (char *)0xa98;
  }
  pBVar21 = BIO_s_mem();
  local_a60 = (Curl_easy *)BIO_new(pBVar21);
  if (((pCVar47->set).ssl.field_0xa0 & 1) != 0) {
    pCVar3 = conn->data;
    ppcVar22 = (char **)SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar14].backend)->handle);
    if (ppcVar22 != (char **)0x0) {
      iVar8 = OPENSSL_sk_num(ppcVar22);
      CVar10 = Curl_ssl_init_certinfo(pCVar3,iVar8);
      if (CVar10 == CURLE_OK) {
        local_a58 = (X509 *)ppcVar22;
        local_a28 = pCVar47;
        pBVar21 = BIO_s_mem();
        pBVar23 = BIO_new(pBVar21);
        if (0 < iVar8) {
          iVar11 = 0;
          local_a38 = (X509 *)CONCAT44(local_a38._4_4_,iVar8);
          do {
            pXVar24 = (X509 *)OPENSSL_sk_value(local_a58,iVar11);
            local_a00 = (ASN1_GENERALIZEDTIME *)0x0;
            pXVar25 = X509_get_subject_name(pXVar24);
            X509_NAME_print_ex(pBVar23,pXVar25,0,0x82031f);
            sVar26 = BIO_ctrl(pBVar23,3,0,&local_a68);
            Curl_ssl_push_certinfo_len(pCVar3,iVar11,"Subject",(char *)local_a68,sVar26);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            pXVar25 = X509_get_issuer_name(pXVar24);
            X509_NAME_print_ex(pBVar23,pXVar25,0,0x82031f);
            sVar26 = BIO_ctrl(pBVar23,3,0,&local_a68);
            Curl_ssl_push_certinfo_len(pCVar3,iVar11,"Issuer",(char *)local_a68,sVar26);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            uVar27 = X509_get_version(pXVar24);
            BIO_printf(pBVar23,"%lx",uVar27);
            sVar26 = BIO_ctrl(pBVar23,3,0,&local_a68);
            local_a70 = (Curl_easy *)CONCAT44(local_a70._4_4_,iVar11);
            Curl_ssl_push_certinfo_len(pCVar3,iVar11,"Version",(char *)local_a68,sVar26);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            local_a30 = pXVar24;
            pAVar28 = X509_get_serialNumber(pXVar24);
            if (pAVar28->type == 0x102) {
              BIO_puts(pBVar23,"-");
            }
            if (0 < pAVar28->length) {
              lVar46 = 0;
              do {
                BIO_printf(pBVar23,"%02x",(ulong)pAVar28->data[lVar46]);
                lVar46 = lVar46 + 1;
              } while (lVar46 < pAVar28->length);
            }
            sVar26 = BIO_ctrl(pBVar23,3,0,&local_a68);
            iVar8 = (int)local_a70;
            Curl_ssl_push_certinfo_len
                      (pCVar3,(int)local_a70,"Serial Number",(char *)local_a68,sVar26);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            local_a48 = (SSL_SESSION *)0x0;
            pAVar29 = ASN1_STRING_new();
            if (pAVar29 != (ASN1_STRING *)0x0) {
              X509_get0_signature(&local_a00,&local_a48,local_a30);
              X509_signature_print(pBVar23,(X509_ALGOR *)local_a48,pAVar29);
              ASN1_STRING_free(pAVar29);
              if (local_a48 != (SSL_SESSION *)0x0) {
                i2a_ASN1_OBJECT(pBVar23,*(ASN1_OBJECT **)local_a48);
                sVar26 = BIO_ctrl(pBVar23,3,0,&local_a68);
                Curl_ssl_push_certinfo_len
                          (pCVar3,iVar8,"Public Key Algorithm",(char *)local_a68,sVar26);
                BIO_ctrl(pBVar23,1,0,(void *)0x0);
              }
            }
            uVar27 = X509_get0_extensions(local_a30);
            iVar11 = OPENSSL_sk_num(uVar27);
            if ((0 < iVar11) && (iVar11 = OPENSSL_sk_num(uVar27), 0 < iVar11)) {
              iVar11 = 0;
              do {
                ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar27,iVar11);
                pBVar21 = BIO_s_mem();
                out = BIO_new(pBVar21);
                if (out == (BIO *)0x0) {
                  iVar8 = (int)local_a70;
                  break;
                }
                a = X509_EXTENSION_get_object(ex);
                i2t_ASN1_OBJECT((char *)local_9b8,0x80,a);
                iVar8 = X509V3_EXT_print(out,ex,0,0);
                if (iVar8 == 0) {
                  v = X509_EXTENSION_get_data(ex);
                  ASN1_STRING_print(out,v);
                }
                BIO_ctrl(out,0x73,0,&local_a78);
                uVar16._0_4_ = local_a78->ssl_version;
                uVar16._4_4_ = local_a78->key_arg_length;
                if (uVar16 != 0) {
                  pXVar24 = local_838;
                  uVar55 = 0;
                  do {
                    pAVar4 = *(ASN1_TYPE **)local_a78->key_arg;
                    bVar59 = *(char *)((long)&pAVar4->type + uVar55) == '\n';
                    pcVar58 = "";
                    if (bVar59) {
                      pcVar58 = ", ";
                    }
                    uVar55 = bVar59 + uVar55;
                    if (uVar55 < uVar16) {
                      cVar50 = *(char *)((long)&pAVar4->type + uVar55);
                      uVar56 = uVar55;
                      while (cVar50 == ' ') {
                        uVar55 = uVar16;
                        if (uVar16 <= uVar56 + 1) goto LAB_0049bc7f;
                        cVar50 = *(char *)((long)&pAVar4->type + uVar56 + 1);
                        uVar56 = uVar56 + 1;
                      }
                      iVar8 = curl_msnprintf((char *)pXVar24,(size_t)(local_638 + -(long)pXVar24),
                                             "%s%c",pcVar58,(ulong)(uint)(int)cVar50);
                      pXVar24 = (X509 *)((long)&pXVar24->cert_info + (long)iVar8);
                      uVar55 = uVar56;
                    }
LAB_0049bc7f:
                    uVar55 = uVar55 + 1;
                    uVar16._0_4_ = local_a78->ssl_version;
                    uVar16._4_4_ = local_a78->key_arg_length;
                  } while (uVar55 < uVar16);
                }
                iVar8 = (int)local_a70;
                Curl_ssl_push_certinfo(pCVar3,(int)local_a70,(char *)local_9b8,(char *)local_838);
                BIO_free(out);
                iVar11 = iVar11 + 1;
                iVar12 = OPENSSL_sk_num(uVar27);
              } while (iVar11 < iVar12);
            }
            pXVar24 = local_a30;
            pAVar30 = (ASN1_TIME *)X509_get0_notBefore(local_a30);
            ASN1_TIME_print(pBVar23,pAVar30);
            sVar26 = BIO_ctrl(pBVar23,3,0,&local_a68);
            Curl_ssl_push_certinfo_len(pCVar3,iVar8,"Start date",(char *)local_a68,sVar26);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            pAVar30 = (ASN1_TIME *)X509_get0_notAfter(pXVar24);
            ASN1_TIME_print(pBVar23,pAVar30);
            sVar26 = BIO_ctrl(pBVar23,3,0,&local_a68);
            Curl_ssl_push_certinfo_len(pCVar3,iVar8,"Expire date",(char *)local_a68,sVar26);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            pEVar31 = X509_get_pubkey(pXVar24);
            if (pEVar31 == (EVP_PKEY *)0x0) {
              Curl_infof(pCVar3,"   Unable to load public key\n");
            }
            else {
              iVar8 = EVP_PKEY_get_id(pEVar31);
              if (iVar8 == 0x74) {
                uVar27 = EVP_PKEY_get0_DSA(pEVar31);
                DSA_get0_pqg(uVar27,local_838,local_9b8,&local_a78);
                DSA_get0_key(uVar27,&local_a48,0);
                iVar8 = (int)local_a70;
                pubkey_show(pCVar3,(BIO *)pBVar23,(int)local_a70,"dsa","p",
                            (BIGNUM *)
                            CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_));
                pubkey_show(pCVar3,(BIO *)pBVar23,iVar8,"dsa","q",(BIGNUM *)local_9b8[0]);
                pubkey_show(pCVar3,(BIO *)pBVar23,iVar8,"dsa","g",(BIGNUM *)local_a78);
                pcVar58 = "dsa";
LAB_0049c035:
                pcVar18 = "pub_key";
                pSVar38 = local_a48;
LAB_0049c03c:
                pubkey_show(pCVar3,(BIO *)pBVar23,iVar8,pcVar58,pcVar18,(BIGNUM *)pSVar38);
              }
              else {
                if (iVar8 == 0x1c) {
                  uVar27 = EVP_PKEY_get0_DH(pEVar31);
                  DH_get0_pqg(uVar27,local_838,local_9b8,&local_a78);
                  DH_get0_key(uVar27,&local_a48,0);
                  iVar8 = (int)local_a70;
                  pubkey_show(pCVar3,(BIO *)pBVar23,(int)local_a70,"dh","p",
                              (BIGNUM *)
                              CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_));
                  pubkey_show(pCVar3,(BIO *)pBVar23,iVar8,"dh","q",(BIGNUM *)local_9b8[0]);
                  pubkey_show(pCVar3,(BIO *)pBVar23,iVar8,"dh","g",(BIGNUM *)local_a78);
                  pcVar58 = "dh";
                  goto LAB_0049c035;
                }
                if (iVar8 == 6) {
                  uVar27 = EVP_PKEY_get0_RSA(pEVar31);
                  RSA_get0_key(uVar27,local_838,local_9b8,0);
                  BN_print(pBVar23,(BIGNUM *)
                                   CONCAT71(local_838[0].cert_info._1_7_,
                                            local_838[0].cert_info._0_1_));
                  sVar26 = BIO_ctrl(pBVar23,3,0,&local_a68);
                  iVar8 = (int)local_a70;
                  Curl_ssl_push_certinfo_len
                            (pCVar3,(int)local_a70,"RSA Public Key",(char *)local_a68,sVar26);
                  BIO_ctrl(pBVar23,1,0,(void *)0x0);
                  pubkey_show(pCVar3,(BIO *)pBVar23,iVar8,"rsa","n",
                              (BIGNUM *)
                              CONCAT71(local_838[0].cert_info._1_7_,local_838[0].cert_info._0_1_));
                  pcVar58 = "rsa";
                  pcVar18 = "e";
                  pSVar38 = local_9b8[0];
                  goto LAB_0049c03c;
                }
              }
              EVP_PKEY_free(pEVar31);
            }
            if (local_a00 != (ASN1_GENERALIZEDTIME *)0x0) {
              if (0 < local_a00->length) {
                lVar46 = 0;
                do {
                  BIO_printf(pBVar23,"%02x:",(ulong)local_a00->data[lVar46]);
                  lVar46 = lVar46 + 1;
                } while (lVar46 < local_a00->length);
              }
              sVar26 = BIO_ctrl(pBVar23,3,0,&local_a68);
              Curl_ssl_push_certinfo_len(pCVar3,(int)local_a70,"Signature",(char *)local_a68,sVar26)
              ;
              BIO_ctrl(pBVar23,1,0,(void *)0x0);
            }
            PEM_write_bio_X509(pBVar23,local_a30);
            sVar26 = BIO_ctrl(pBVar23,3,0,&local_a68);
            iVar11 = (int)local_a70;
            Curl_ssl_push_certinfo_len(pCVar3,(int)local_a70,"Cert",(char *)local_a68,sVar26);
            BIO_ctrl(pBVar23,1,0,(void *)0x0);
            iVar11 = iVar11 + 1;
          } while (iVar11 != (int)local_a38);
        }
        BIO_free(pBVar23);
        pCVar47 = local_a28;
      }
    }
  }
  pXVar32 = (X509 *)SSL_get1_peer_certificate((conn->ssl[lVar14].backend)->handle);
  (conn->ssl[lVar14].backend)->server_cert = pXVar32;
  if (pXVar32 == (X509 *)0x0) {
    BIO_free((BIO *)local_a60);
    CVar10 = CURLE_OK;
    if ((char)local_a50 != '\0') {
      Curl_failf(pCVar47,"SSL: couldn\'t get peer certificate!");
      CVar10 = CURLE_PEER_FAILED_VERIFICATION;
    }
    goto LAB_0049d63e;
  }
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    pcVar58 = "Proxy";
    if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
      pcVar58 = "Server";
    }
  }
  else {
    pcVar58 = "Server";
  }
  Curl_infof(pCVar47,"%s certificate:\n",pcVar58);
  pXVar25 = X509_get_subject_name((X509 *)(conn->ssl[lVar14].backend)->server_cert);
  iVar8 = x509_name_oneline((X509_NAME *)pXVar25,(char *)local_838,size);
  pXVar24 = (X509 *)"[NONE]";
  if (iVar8 == 0) {
    pXVar24 = local_838;
  }
  Curl_infof(pCVar47," subject: %s\n",pXVar24);
  pAVar30 = (ASN1_TIME *)X509_get0_notBefore((conn->ssl[lVar14].backend)->server_cert);
  pCVar3 = local_a60;
  ASN1_TIME_print((BIO *)local_a60,pAVar30);
  lVar46 = BIO_ctrl((BIO *)pCVar3,3,0,&local_9c0);
  Curl_infof(pCVar47," start date: %.*s\n",lVar46);
  BIO_ctrl((BIO *)pCVar3,1,0,(void *)0x0);
  pAVar30 = (ASN1_TIME *)X509_get0_notAfter((conn->ssl[lVar14].backend)->server_cert);
  ASN1_TIME_print((BIO *)pCVar3,pAVar30);
  lVar46 = BIO_ctrl((BIO *)pCVar3,3,0,&local_9c0);
  Curl_infof(pCVar47," expire date: %.*s\n",lVar46);
  BIO_ctrl((BIO *)pCVar3,1,0,(void *)0x0);
  BIO_free((BIO *)pCVar3);
  cVar2 = (conn->http_proxy).proxytype;
  if ((cVar2 == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    if (((conn->proxy_ssl_config).field_0x48 & 2) == 0) goto LAB_0049cd94;
LAB_0049c343:
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar46 = 0x160, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar46 = 0xd0;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar17 = 0x168, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar17 = 0xd8;
    }
    pXVar24 = (X509 *)(conn->ssl[lVar14].backend)->server_cert;
    local_a60 = conn->data;
    pcVar58 = *(char **)((conn->chunk).hexbuffer + lVar46 + -0x20);
    local_a10 = *(undefined8 *)((conn->chunk).hexbuffer + lVar17 + -0x20);
    local_a28 = pCVar47;
    local_a18 = pcVar58;
    if ((((conn->bits).field_0x5 & 2) == 0) || (iVar8 = inet_pton(10,pcVar58,local_9b8), iVar8 == 0)
       ) {
      iVar8 = inet_pton(2,pcVar58,local_9b8);
      local_a38 = (X509 *)(ulong)((uint)(iVar8 != 0) * 4);
      local_a70 = (Curl_easy *)CONCAT44(local_a70._4_4_,(uint)(iVar8 != 0) * 5 + 2);
    }
    else {
      local_a70 = (Curl_easy *)CONCAT44(local_a70._4_4_,7);
      local_a38 = (X509 *)0x10;
    }
    CVar10 = CURLE_OK;
    ppcVar22 = (char **)0x0;
    a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar24,0x55,(int *)0x0,(int *)0x0);
    if (a_00 == (GENERAL_NAMES *)0x0) {
      bVar6 = 0;
      bVar57 = 0;
    }
    else {
      iVar8 = OPENSSL_sk_num(a_00);
      local_a30 = (X509 *)CONCAT44(local_a30._4_4_,iVar8);
      if (iVar8 < 1) {
        bVar6 = 0;
        bVar57 = 0;
      }
      else {
        iVar8 = 1;
        local_a88 = (char **)0x0;
        local_a58 = (X509 *)0x0;
        local_a20 = (ssl_connect_data *)0x0;
        bVar57 = 0;
        local_9f0 = pXVar24;
        do {
          piVar33 = (int *)OPENSSL_sk_value(a_00,iVar8 + -1);
          iVar11 = *piVar33;
          uVar44 = (undefined7)((ulong)ppcVar22 >> 8);
          if (iVar11 == 2) {
            ppcVar22 = (char **)CONCAT71(uVar44,1);
            local_a88 = ppcVar22;
          }
          else if (iVar11 == 7) {
            ppcVar22 = (char **)CONCAT71(uVar44,1);
            local_a58 = (X509 *)ppcVar22;
          }
          iVar12 = (int)local_a70;
          if (iVar11 == (int)local_a70) {
            __s = (char **)ASN1_STRING_get0_data(*(undefined8 *)(piVar33 + 2));
            iVar11 = ASN1_STRING_length(*(ASN1_STRING **)(piVar33 + 2));
            pXVar24 = (X509 *)(long)iVar11;
            if (iVar12 == 7) {
              if ((local_a38 == pXVar24) &&
                 (iVar11 = bcmp(__s,local_9b8,(size_t)pXVar24), iVar11 == 0)) {
                Curl_infof(local_a60," subjectAltName: host \"%s\" matched cert\'s IP address!\n",
                           local_a10);
                local_a20 = (ssl_connect_data *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              }
            }
            else if (((iVar12 == 2) && (pXVar34 = (X509 *)strlen((char *)__s), pXVar34 == pXVar24))
                    && (iVar11 = Curl_cert_hostcheck((char *)__s,local_a18), iVar11 != 0)) {
              Curl_infof(local_a60," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",local_a10
                         ,__s);
              bVar57 = 1;
              ppcVar22 = __s;
            }
          }
        } while ((iVar8 < (curl_socket_t)local_a30) && (iVar8 = iVar8 + 1, bVar57 == 0));
        bVar6 = (byte)local_a88 | (byte)local_a58;
        bVar57 = bVar57 | (byte)local_a20;
        pXVar24 = local_9f0;
      }
      GENERAL_NAMES_free(a_00);
    }
    uVar27 = local_a10;
    pCVar47 = local_a28;
    pCVar3 = local_a60;
    if ((bVar57 & 1) == 0) {
      if ((bVar6 & 1) == 0) {
        local_a78 = (SSL_SESSION *)0x5172a2;
        pXVar25 = X509_get_subject_name(pXVar24);
        if (pXVar25 == (X509_NAME *)0x0) {
          iVar8 = -1;
        }
        else {
          iVar11 = -1;
          do {
            iVar8 = iVar11;
            iVar11 = X509_NAME_get_index_by_NID(pXVar25,0xd,iVar8);
          } while (-1 < iVar11);
        }
        CVar10 = CURLE_OK;
        bVar59 = true;
        if (-1 < iVar8) {
          ne = X509_NAME_get_entry(pXVar25,iVar8);
          pAVar29 = X509_NAME_ENTRY_get_data(ne);
          if (pAVar29 != (ASN1_STRING *)0x0) {
            iVar8 = ASN1_STRING_type(pAVar29);
            if (iVar8 == 0xc) {
              uVar9 = ASN1_STRING_length(pAVar29);
              if ((-1 < (int)uVar9) &&
                 (pSVar38 = (SSL_SESSION *)
                            CRYPTO_malloc(uVar9 + 1,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmcurl/lib/vtls/openssl.c"
                                          ,0x66c), local_a78 = pSVar38,
                 pSVar38 != (SSL_SESSION *)0x0)) {
                __src = (void *)ASN1_STRING_get0_data(pAVar29);
                memcpy(pSVar38,__src,(ulong)uVar9);
                *(undefined1 *)((long)local_a78->key_arg + ((ulong)uVar9 - 8)) = 0;
              }
            }
            else {
              uVar9 = ASN1_STRING_to_UTF8((uchar **)&local_a78,pAVar29);
            }
            if (local_a78 != (SSL_SESSION *)0x0) {
              uznum = strlen((char *)local_a78);
              uVar13 = curlx_uztosi(uznum);
              if (uVar13 != uVar9) {
                bVar59 = false;
                Curl_failf(local_a60,"SSL: illegal cert name field");
                CVar10 = CURLE_PEER_FAILED_VERIFICATION;
              }
            }
          }
        }
        pCVar47 = local_a28;
        if (local_a78 == (SSL_SESSION *)0x5172a2) {
          local_a78 = (SSL_SESSION *)0x0;
        }
        if (bVar59) {
          if (local_a78 == (SSL_SESSION *)0x0) {
            Curl_failf(local_a60,"SSL: unable to obtain common name from peer certificate");
          }
          else {
            iVar8 = Curl_cert_hostcheck((char *)local_a78,local_a18);
            if (iVar8 != 0) {
              CVar10 = CURLE_OK;
              Curl_infof(local_a60," common name: %s (matched)\n");
              goto LAB_0049cd71;
            }
            Curl_failf(local_a60,
                       "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                       ,local_a78,local_a10);
          }
          CVar10 = CURLE_PEER_FAILED_VERIFICATION;
        }
LAB_0049cd71:
        if (local_a78 != (SSL_SESSION *)0x0) {
          CRYPTO_free(local_a78);
        }
      }
      else {
        Curl_infof(local_a60," subjectAltName does not match %s\n",local_a10);
        Curl_failf(pCVar3,
                   "SSL: no alternative certificate subject name matches target host name \'%s\'",
                   uVar27);
        CVar10 = CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    if (CVar10 == CURLE_OK) goto LAB_0049cd94;
LAB_0049d4ab:
    X509_free((X509 *)(conn->ssl[lVar14].backend)->server_cert);
    (conn->ssl[lVar14].backend)->server_cert = (X509 *)0x0;
  }
  else {
    if (((conn->ssl_config).field_0x48 & 2) != 0) goto LAB_0049c343;
LAB_0049cd94:
    pXVar25 = X509_get_issuer_name((X509 *)(conn->ssl[lVar14].backend)->server_cert);
    iVar8 = x509_name_oneline((X509_NAME *)pXVar25,(char *)local_838,size_00);
    if (iVar8 == 0) {
      Curl_infof(pCVar47," issuer: %s\n",local_838);
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if ((pCVar47->set).proxy_ssl.issuercert != (char *)0x0) goto LAB_0049cf05;
LAB_0049d36c:
        lVar46 = SSL_get_verify_result((SSL *)(conn->ssl[lVar14].backend)->handle);
        *(long *)((long)&pCVar47->next + (long)local_9e8) = lVar46;
        if (lVar46 == 0) {
          CVar48 = CURLE_OK;
          Curl_infof(pCVar47," SSL certificate verify ok.\n");
        }
        else {
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            bVar6 = (conn->proxy_ssl_config).field_0x48;
          }
          else {
            bVar6 = (conn->ssl_config).field_0x48;
          }
          if ((bVar6 & 1) == 0) {
            pcVar58 = X509_verify_cert_error_string(lVar46);
            CVar48 = CURLE_OK;
            Curl_infof(pCVar47," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                       pcVar58,lVar46);
          }
          else {
            CVar48 = CURLE_PEER_FAILED_VERIFICATION;
            if ((char)local_a50 != '\0') {
              pcVar58 = X509_verify_cert_error_string(lVar46);
              Curl_failf(pCVar47,"SSL certificate verify result: %s (%ld)",pcVar58,lVar46);
            }
          }
        }
        goto LAB_0049cdd2;
      }
      if ((pCVar47->set).ssl.issuercert == (char *)0x0) goto LAB_0049d36c;
LAB_0049cf05:
      pBVar21 = BIO_s_file();
      pBVar23 = BIO_new(pBVar21);
      if (pBVar23 == (BIO *)0x0) {
        uVar16 = ERR_get_error();
        ERR_error_string_n(uVar16,(char *)&local_938,0x100);
        Curl_failf(pCVar47,"BIO_new return NULL, OpenSSL error %s",&local_938);
        X509_free((X509 *)(conn->ssl[lVar14].backend)->server_cert);
        (conn->ssl[lVar14].backend)->server_cert = (X509 *)0x0;
        CVar10 = CURLE_OUT_OF_MEMORY;
      }
      else {
        if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
           (lVar46 = 0xb50, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar46 = 0xaa8;
        }
        lVar46 = BIO_ctrl(pBVar23,0x6c,3,*(void **)((long)&pCVar47->next + lVar46));
        if ((int)lVar46 < 1) {
          if ((char)local_a50 != '\0') {
            if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
               (lVar46 = 0xb50,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar46 = 0xaa8;
            }
            Curl_failf(pCVar47,"SSL: Unable to open issuer cert (%s)",
                       *(undefined8 *)((long)&pCVar47->next + lVar46));
          }
          BIO_free(pBVar23);
        }
        else {
          pXVar24 = PEM_read_bio_X509(pBVar23,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar24 != (X509 *)0x0) {
            iVar8 = X509_check_issued(pXVar24,(X509 *)(conn->ssl[lVar14].backend)->server_cert);
            if (iVar8 == 0) {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar46 = 0xb50,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar46 = 0xaa8;
              }
              Curl_infof(pCVar47," SSL certificate issuer check ok (%s)\n",
                         *(undefined8 *)((long)&pCVar47->next + lVar46));
              BIO_free(pBVar23);
              X509_free(pXVar24);
              goto LAB_0049d36c;
            }
            if ((char)local_a50 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar46 = 0xb50,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar46 = 0xaa8;
              }
              Curl_failf(pCVar47,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((long)&pCVar47->next + lVar46));
            }
            BIO_free(pBVar23);
            X509_free(pXVar24);
            X509_free((X509 *)(conn->ssl[lVar14].backend)->server_cert);
            (conn->ssl[lVar14].backend)->server_cert = (X509 *)0x0;
            CVar10 = CURLE_SSL_ISSUER_ERROR;
            goto LAB_0049d63e;
          }
          if ((char)local_a50 != '\0') {
            if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
               (lVar46 = 0xb50,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar46 = 0xaa8;
            }
            Curl_failf(pCVar47,"SSL: Unable to read issuer cert (%s)",
                       *(undefined8 *)((long)&pCVar47->next + lVar46));
          }
          BIO_free(pBVar23);
          X509_free((X509 *)0x0);
        }
        X509_free((X509 *)(conn->ssl[lVar14].backend)->server_cert);
        (conn->ssl[lVar14].backend)->server_cert = (X509 *)0x0;
        CVar10 = CURLE_SSL_ISSUER_ERROR;
      }
    }
    else {
      CVar48 = CURLE_PEER_FAILED_VERIFICATION;
      if ((char)local_a50 != '\0') {
        Curl_failf(pCVar47,"SSL: couldn\'t get X509-issuer name!");
      }
LAB_0049cdd2:
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        bVar6 = (conn->proxy_ssl_config).field_0x48;
      }
      else {
        bVar6 = (conn->ssl_config).field_0x48;
      }
      if ((bVar6 & 4) != 0) {
        pCVar3 = conn->data;
        lVar46 = SSL_ctrl((SSL *)(conn->ssl[lVar14].backend)->handle,0x46,0,local_9b8);
        if (local_9b8[0] == (SSL_SESSION *)0x0) {
          pcVar58 = "No OCSP response received";
LAB_0049d02b:
          Curl_failf(pCVar3,pcVar58);
          CVar10 = CURLE_SSL_INVALIDCERTSTATUS;
          bs = (OCSP_BASICRESP *)0x0;
          resp = (Curl_easy *)0x0;
        }
        else {
          local_a78 = local_9b8[0];
          resp = (Curl_easy *)d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&local_a78,lVar46);
          if (resp == (Curl_easy *)0x0) {
            pcVar58 = "Invalid OCSP response";
            goto LAB_0049d02b;
          }
          uVar9 = OCSP_response_status((OCSP_RESPONSE *)resp);
          if (uVar9 == 0) {
            bs = OCSP_response_get1_basic((OCSP_RESPONSE *)resp);
            if (bs == (OCSP_BASICRESP *)0x0) {
              pcVar58 = "Invalid OCSP response";
              bs = (OCSP_BASICRESP *)0x0;
LAB_0049d482:
              Curl_failf(pCVar3,pcVar58);
              goto LAB_0049d489;
            }
            certs = SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar14].backend)->handle);
            pXVar36 = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar14].backend)->ctx);
            CVar10 = CURLE_OK;
            iVar8 = OCSP_basic_verify(bs,certs,pXVar36,0);
            if (iVar8 < 1) {
              pcVar58 = "OCSP response verification failed";
              goto LAB_0049d482;
            }
            iVar8 = OCSP_resp_count(bs);
            if (0 < iVar8) {
              iVar8 = 0;
              CVar10 = CURLE_OK;
              local_a70 = resp;
              do {
                single = OCSP_resp_get0(bs,iVar8);
                if (single == (OCSP_SINGLERESP *)0x0) {
                  uVar9 = 5;
                }
                else {
                  uVar9 = OCSP_single_get0_status
                                    (single,(int *)&local_9f4,&local_a68,&local_a00,
                                     (ASN1_GENERALIZEDTIME **)&local_a48);
                  iVar11 = OCSP_check_validity(local_a00,(ASN1_GENERALIZEDTIME *)local_a48,300,-1);
                  if (iVar11 == 0) {
                    Curl_failf(pCVar3,"OCSP response has expired");
                    uVar9 = 2;
                    CVar10 = CURLE_SSL_INVALIDCERTSTATUS;
                  }
                  else {
                    pcVar58 = OCSP_cert_status_str((long)(int)uVar9);
                    Curl_infof(pCVar3,"SSL certificate status: %s (%d)\n",pcVar58,(ulong)uVar9);
                    if (uVar9 != 2) {
                      if (uVar9 != 1) {
                        uVar9 = 0;
                        goto LAB_0049d1f5;
                      }
                      pcVar58 = OCSP_crl_reason_str((long)(int)local_9f4);
                      Curl_failf(pCVar3,"SSL certificate revocation reason: %s (%d)",pcVar58,
                                 (ulong)local_9f4);
                      uVar9 = 2;
                    }
                    CVar10 = CURLE_SSL_INVALIDCERTSTATUS;
                  }
                }
LAB_0049d1f5:
                if ((uVar9 != 0) && (uVar9 != 5)) {
                  resp = local_a70;
                  if (uVar9 != 2) goto LAB_0049d4a3;
                  break;
                }
                iVar8 = iVar8 + 1;
                iVar11 = OCSP_resp_count(bs);
                resp = local_a70;
              } while (iVar8 < iVar11);
            }
          }
          else {
            pcVar58 = OCSP_response_status_str((long)(int)uVar9);
            bs = (OCSP_BASICRESP *)0x0;
            Curl_failf(pCVar3,"Invalid OCSP response status: %s (%d)",pcVar58,(ulong)uVar9);
LAB_0049d489:
            CVar10 = CURLE_SSL_INVALIDCERTSTATUS;
          }
        }
        if (bs != (OCSP_BASICRESP *)0x0) {
          OCSP_BASICRESP_free(bs);
        }
        OCSP_RESPONSE_free((OCSP_RESPONSE *)resp);
LAB_0049d4a3:
        if (CVar10 != CURLE_OK) goto LAB_0049d4ab;
        CVar48 = CURLE_OK;
      }
      CVar10 = CURLE_OK;
      if ((char)local_a50 != '\0') {
        CVar10 = CVar48;
      }
      if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
         (lVar46 = 0xd18, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar46 = 0xd10;
      }
      pcVar58 = *(char **)((long)&pCVar47->next + lVar46);
      local_9c0 = pcVar58;
      if (pcVar58 != (char *)0x0 && CVar10 == CURLE_OK) {
        pXVar32 = (conn->ssl[lVar14].backend)->server_cert;
        local_9b8[0] = (SSL_SESSION *)0x0;
        if (pXVar32 == (X509 *)0x0) {
          CVar10 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          pXVar37 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar32);
          uVar9 = i2d_X509_PUBKEY(pXVar37,(uchar **)0x0);
          CVar10 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          pSVar38 = (SSL_SESSION *)0x0;
          if (0 < (int)uVar9) {
            uVar16 = (ulong)uVar9;
            pSVar38 = (SSL_SESSION *)(*Curl_cmalloc)(uVar16);
            local_9b8[0] = pSVar38;
            if (pSVar38 == (SSL_SESSION *)0x0) {
              pSVar38 = (SSL_SESSION *)0x0;
            }
            else {
              pXVar37 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar32);
              uVar13 = i2d_X509_PUBKEY(pXVar37,(uchar **)local_9b8);
              if ((local_9b8[0] != (SSL_SESSION *)0x0 && uVar9 == uVar13) &&
                  (long)local_9b8[0] - (long)pSVar38 == uVar16) {
                CVar10 = Curl_pin_peer_pubkey(pCVar47,pcVar58,(uchar *)pSVar38,uVar16);
              }
            }
          }
          if (pSVar38 != (SSL_SESSION *)0x0) {
            (*Curl_cfree)(pSVar38);
          }
        }
        if (CVar10 == CURLE_OK) {
          CVar10 = CURLE_OK;
        }
        else {
          Curl_failf(pCVar47,"SSL: public key does not match pinned public key!");
        }
      }
      X509_free((X509 *)(conn->ssl[lVar14].backend)->server_cert);
      (conn->ssl[lVar14].backend)->server_cert = (X509 *)0x0;
      conn->ssl[lVar14].connecting_state = ssl_connect_done;
    }
  }
LAB_0049d63e:
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
  conn->ssl[lVar14].connecting_state = ssl_connect_done;
LAB_0049d64e:
  bVar59 = conn->ssl[lVar14].connecting_state == ssl_connect_done;
  if (bVar59) {
    conn->ssl[lVar14].state = ssl_connection_complete;
    conn->recv[local_9e0] = ossl_recv;
    conn->send[local_9e0] = ossl_send;
  }
  *local_9d0 = bVar59;
  conn->ssl[lVar14].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}